

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.yy.cpp
# Opt level: O0

YY_BUFFER_STATE yy_scan_buffer(char *base,yy_size_t size,yyscan_t yyscanner)

{
  char *in_RDX;
  yyscan_t in_RSI;
  YY_BUFFER_STATE in_RDI;
  YY_BUFFER_STATE b;
  yyscan_t in_stack_ffffffffffffffd8;
  YY_BUFFER_STATE local_8;
  
  if (((in_RSI < (yyscan_t)0x2) || (*(char *)((long)in_RDI + ((long)in_RSI - 2U)) != '\0')) ||
     (*(char *)((long)in_RDI + ((long)in_RSI - 1U)) != '\0')) {
    local_8 = (YY_BUFFER_STATE)0x0;
  }
  else {
    local_8 = (YY_BUFFER_STATE)yyalloc((yy_size_t)in_RDX,in_stack_ffffffffffffffd8);
    if (local_8 == (YY_BUFFER_STATE)0x0) {
      yy_fatal_error(in_RDX,(yyscan_t)0x0);
    }
    local_8->yy_buf_size = (int)in_RSI + -2;
    local_8->yy_ch_buf = (char *)in_RDI;
    local_8->yy_buf_pos = (char *)in_RDI;
    local_8->yy_is_our_buffer = 0;
    local_8->yy_input_file = (FILE *)0x0;
    local_8->yy_n_chars = local_8->yy_buf_size;
    local_8->yy_is_interactive = 0;
    local_8->yy_at_bol = 1;
    local_8->yy_fill_buffer = 0;
    local_8->yy_buffer_status = 0;
    yy_switch_to_buffer(in_RDI,in_RSI);
  }
  return local_8;
}

Assistant:

YY_BUFFER_STATE yy_scan_buffer  (char * base, yy_size_t  size , yyscan_t yyscanner)
{
	YY_BUFFER_STATE b;
    
	if ( size < 2 ||
	     base[size-2] != YY_END_OF_BUFFER_CHAR ||
	     base[size-1] != YY_END_OF_BUFFER_CHAR )
		/* They forgot to leave room for the EOB's. */
		return NULL;

	b = (YY_BUFFER_STATE) yyalloc( sizeof( struct yy_buffer_state ) , yyscanner );
	if ( ! b )
		YY_FATAL_ERROR( "out of dynamic memory in yy_scan_buffer()" );

	b->yy_buf_size = (int) (size - 2);	/* "- 2" to take care of EOB's */
	b->yy_buf_pos = b->yy_ch_buf = base;
	b->yy_is_our_buffer = 0;
	b->yy_input_file = NULL;
	b->yy_n_chars = b->yy_buf_size;
	b->yy_is_interactive = 0;
	b->yy_at_bol = 1;
	b->yy_fill_buffer = 0;
	b->yy_buffer_status = YY_BUFFER_NEW;

	yy_switch_to_buffer( b , yyscanner );

	return b;
}